

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_asset_value_commitment
              (uint64_t value,uchar *vbf,size_t vbf_len,uchar *generator,size_t generator_len,
              uchar *bytes_out,size_t len)

{
  int iVar1;
  secp256k1_context *ctx_00;
  bool bVar2;
  undefined1 local_c8 [7];
  _Bool ok;
  secp256k1_pedersen_commitment commit;
  secp256k1_generator gen;
  secp256k1_context *ctx;
  uchar *bytes_out_local;
  size_t generator_len_local;
  uchar *generator_local;
  size_t vbf_len_local;
  uchar *vbf_local;
  uint64_t value_local;
  
  ctx_00 = secp_ctx();
  if (ctx_00 == (secp256k1_context *)0x0) {
    value_local._4_4_ = -3;
  }
  else if ((((vbf == (uchar *)0x0) || (vbf_len != 0x20)) || (bytes_out == (uchar *)0x0)) ||
          ((len != 0x21 ||
           (iVar1 = get_generator(ctx_00,generator,generator_len,
                                  (secp256k1_generator *)(commit.data + 0x38)), iVar1 != 0)))) {
    value_local._4_4_ = -2;
  }
  else {
    iVar1 = secp256k1_pedersen_commit
                      (ctx_00,(secp256k1_pedersen_commitment *)local_c8,vbf,value,
                       (secp256k1_generator *)(commit.data + 0x38));
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_pedersen_commitment_serialize
                        (ctx_00,bytes_out,(secp256k1_pedersen_commitment *)local_c8);
      bVar2 = iVar1 != 0;
    }
    wally_clear_2(commit.data + 0x38,0x40,local_c8,0x40);
    value_local._4_4_ = -2;
    if (bVar2) {
      value_local._4_4_ = 0;
    }
  }
  return value_local._4_4_;
}

Assistant:

int wally_asset_value_commitment(uint64_t value,
                                 const unsigned char *vbf, size_t vbf_len,
                                 const unsigned char *generator, size_t generator_len,
                                 unsigned char *bytes_out, size_t len)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!vbf || vbf_len != ASSET_TAG_LEN || !bytes_out || len != ASSET_COMMITMENT_LEN ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK)
        return WALLY_EINVAL;

    ok = secp256k1_pedersen_commit(ctx, &commit, vbf, value, &gen) &&
         secp256k1_pedersen_commitment_serialize(ctx, bytes_out, &commit);

    wally_clear_2(&gen, sizeof(gen), &commit, sizeof(commit));
    return ok ? WALLY_OK : WALLY_EINVAL;
}